

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

QString * __thiscall QCss::Value::toString(QString *__return_storage_ptr__,Value *this)

{
  char *pcVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  int iVar5;
  storage_type *psVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->type == KnownIdentifier) {
    iVar5 = ::QVariant::toInt((bool *)&this->variant);
    psVar6 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar6 + (ulong)""[iVar5] * 0x28 + 0x6d1b51;
      psVar6 = psVar6 + 1;
    } while (*pcVar1 != '\0');
    QVar7.m_data = psVar6;
    QVar7.m_size = (qsizetype)&local_38;
    QString::fromLatin1(QVar7);
    qVar4 = local_28;
    pcVar3 = pcStack_30;
    pDVar2 = local_38;
    local_38 = (Data *)0x0;
    pcStack_30 = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar3;
    local_28 = 0;
    (__return_storage_ptr__->d).size = qVar4;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    ::QVariant::toString();
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString Value::toString() const
{
    if (type == KnownIdentifier) {
        return QLatin1StringView(values[indexOfId[variant.toInt()]].name);
    } else {
        return variant.toString();
    }
}